

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O3

void __thiscall MxxColl_ScatterGeneral_Test::TestBody(MxxColl_ScatterGeneral_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  undefined1 (*out) [16];
  MPI_Comm poVar5;
  long lVar6;
  value_type_conflict *__val;
  long lVar7;
  int iVar8;
  char *message;
  undefined1 auVar9 [16];
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> vec;
  comm c;
  Message local_90;
  AssertHelper local_88;
  undefined1 (*local_80) [16];
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  vector<int,_std::allocator<int>_> local_68;
  comm local_50;
  long lVar10;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&ompi_mpi_comm_world;
  mxx::comm::comm(&local_50,(MPI_Comm *)&local_68);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((local_50.m_rank == 0) &&
     (std::vector<int,_std::allocator<int>_>::resize(&local_68,(long)local_50.m_size * 5),
     auVar2 = _DAT_0015d030, auVar1 = _DAT_0015d020, 0 < local_50.m_size)) {
    iVar4 = 2;
    lVar6 = 0;
    poVar5 = (MPI_Comm)
             local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      lVar7 = 1;
      auVar9 = auVar1;
      iVar8 = iVar4;
      do {
        if (SUB164(auVar9 ^ auVar2,4) == -0x80000000 && SUB164(auVar9 ^ auVar2,0) < -0x7ffffffb) {
          *(int *)(poVar5 + (lVar7 + -1) * 4) = iVar8 + -2;
          *(int *)(poVar5 + lVar7 * 4) = iVar8;
        }
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 2;
        iVar8 = iVar8 + 4;
      } while (lVar7 != 7);
      lVar6 = lVar6 + 1;
      poVar5 = poVar5 + 0x14;
      iVar4 = iVar4 + 3;
    } while (lVar6 < local_50.m_size);
  }
  out = (undefined1 (*) [16])operator_new(0x14);
  *out = (undefined1  [16])0x0;
  *(undefined4 *)out[1] = 0;
  local_80 = out;
  mxx::scatter<int>(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,5,(int *)out,0,&local_50);
  lVar6 = 0;
  do {
    local_90.ss_.ptr_._0_4_ = local_50.m_rank * 3 + (int)lVar6;
    testing::internal::CmpHelperEQ<int,int>
              (local_78,"2*j+3*c.rank()","result[j]",(int *)&local_90,(int *)out);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message(&local_90);
      if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = "";
      }
      else {
        message = ((local_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0x76,message);
      testing::internal::AssertHelper::operator=(&local_88,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (((CONCAT44(local_90.ss_.ptr_._4_4_,(int)local_90.ss_.ptr_) != 0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         ((long *)CONCAT44(local_90.ss_.ptr_._4_4_,(int)local_90.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_90.ss_.ptr_._4_4_,(int)local_90.ss_.ptr_) + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      break;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar6 = lVar6 + 2;
    out = (undefined1 (*) [16])(*out + 4);
  } while (lVar6 != 10);
  operator_delete(local_80,0x14);
  if ((MPI_Comm)
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (MPI_Comm)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  mxx::comm::~comm(&local_50);
  return;
}

Assistant:

TEST(MxxColl, ScatterGeneral) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    size_t msgsize = 5;

    // scatter from 0
    if (c.rank() == 0) {
        vec.resize(c.size()*msgsize);
        for (int i = 0; i < c.size(); ++i) {
            for (size_t j = 0; j < msgsize; ++j)
            {
                vec[i*msgsize + j] = 2*j + 3*i;
            }
        }
    }
    std::vector<int> result(msgsize);
    mxx::scatter(&vec[0], msgsize, &result.front(), 0, c);
    for (int j = 0; j < (int)msgsize; ++j) {
        ASSERT_EQ(2*j+3*c.rank(), result[j]);
    }
}